

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_connect(connectdata *conn,int sockindex)

{
  _Bool _Var1;
  CURLcode CVar2;
  
  if ((conn->bits).proxy_ssl_connected[sockindex] == true) {
    ssl_connect_init_proxy(conn,sockindex);
  }
  _Var1 = ssl_prefs_check(conn->data);
  if (_Var1) {
    conn->ssl[sockindex].use = true;
    conn->ssl[sockindex].state = ssl_connection_negotiating;
    CVar2 = Curl_ossl_connect(conn,sockindex);
    if (CVar2 == CURLE_OK) {
      Curl_pgrsTime(conn->data,TIMER_APPCONNECT);
      CVar2 = CURLE_OK;
    }
  }
  else {
    CVar2 = CURLE_SSL_CONNECT_ERROR;
  }
  return CVar2;
}

Assistant:

CURLcode
Curl_ssl_connect(struct connectdata *conn, int sockindex)
{
  CURLcode result;

  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }

  if(!ssl_prefs_check(conn->data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl-enabled from here on. */
  conn->ssl[sockindex].use = TRUE;
  conn->ssl[sockindex].state = ssl_connection_negotiating;

  result = curlssl_connect(conn, sockindex);

  if(!result)
    Curl_pgrsTime(conn->data, TIMER_APPCONNECT); /* SSL is connected */

  return result;
}